

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prep.h
# Opt level: O0

void __thiscall
Professor::Professor
          (Professor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *data)

{
  int iVar1;
  reference pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *data_local;
  Professor *this_local;
  
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->surname);
  std::__cxx11::string::string((string *)&this->middle_name);
  std::__cxx11::string::string((string *)&this->link);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](data,0);
  iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
  this->prep_id = iVar1;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](data,1);
  std::__cxx11::string::operator=((string *)&this->name,(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](data,2);
  std::__cxx11::string::operator=((string *)&this->surname,(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](data,3);
  std::__cxx11::string::operator=((string *)&this->middle_name,(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](data,4);
  iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
  this->knowledge = (double)iVar1;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](data,5);
  iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
  this->skill = (double)iVar1;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](data,6);
  iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
  this->social = (double)iVar1;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](data,7);
  iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
  this->loyality = (double)iVar1;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](data,8);
  iVar1 = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
  this->total = (double)iVar1;
  std::__cxx11::string::operator=((string *)&this->link,"");
  return;
}

Assistant:

Professor(std::vector<std::string> data) {
        prep_id = std::stoi(data[0]);
        name = data[1];
        surname = data[2];
        middle_name = data[3];
        knowledge = std::stoi(data[4]);
        skill = std::stoi(data[5]);
        social = std::stoi(data[6]);
        loyality = std::stoi(data[7]);
        total = std::stoi(data[8]);
        link = "";

    }